

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBHub.cpp
# Opt level: O1

void __thiscall ADSBHubConnection::Main(ADSBHubConnection *this)

{
  string *__rhs;
  __fd_mask *p_Var1;
  char cVar2;
  uint uVar3;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  size_t num;
  rep rVar8;
  NetRuntimeError *pNVar9;
  uint uVar10;
  FormatTy FVar11;
  long lVar12;
  uint8_t *buffer;
  fd_set *pfVar13;
  FDDynamicData *pFVar14;
  int __flags;
  _Alloc_hider _Var15;
  SOCKET *__pipedes;
  int iVar16;
  char *pcVar17;
  byte bVar18;
  string local_2a0;
  char *local_280;
  SOCKET *local_278;
  SocketNetworking *local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  ThreadSettings TS;
  string local_1f8;
  timeval timeout;
  fd_set sRead;
  timeval *__timeout;
  
  bVar18 = 0;
  ThreadSettings::ThreadSettings(&TS,"LT_ADSBHub",0x1fbf,"C");
  this->eFormat = FMT_UNKNOWN;
  (this->lnLeftOver)._M_string_length = 0;
  *(this->lnLeftOver)._M_dataplus._M_p = '\0';
  LTFlightData::FDKeyTy::clear(&this->fdKey);
  p_Var1 = sRead.fds_bits + 2;
  sRead.fds_bits[1] = 0;
  sRead.fds_bits[2] = sRead.fds_bits[2] & 0xffffffffffffff00;
  sRead.fds_bits[4] = (__fd_mask)(sRead.fds_bits + 6);
  sRead.fds_bits[5] = 0;
  sRead.fds_bits[6] = sRead.fds_bits[6] & 0xffffffffffffff00;
  sRead.fds_bits[8] = (__fd_mask)(sRead.fds_bits + 10);
  sRead.fds_bits[9] = 0;
  sRead.fds_bits[10] = sRead.fds_bits[10] & 0xffffffffffffff00;
  sRead.fds_bits[0xc] = (__fd_mask)(sRead.fds_bits + 0xe);
  sRead.fds_bits[0xd] = 0;
  sRead.fds_bits[0xe] = sRead.fds_bits[0xe] & 0xffffffffffffff00;
  sRead.fds_bits[0] = (__fd_mask)p_Var1;
  LTFlightData::FDStaticData::operator=(&this->stat,(FDStaticData *)&sRead);
  LTFlightData::FDStaticData::~FDStaticData((FDStaticData *)&sRead);
  LTFlightData::FDDynamicData::FDDynamicData((FDDynamicData *)&sRead);
  pfVar13 = &sRead;
  pFVar14 = &this->dyn;
  for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
    (pFVar14->radar).size = pfVar13->fds_bits[0];
    pfVar13 = (fd_set *)((long)pfVar13 + ((ulong)bVar18 * -2 + 1) * 8);
    pFVar14 = (FDDynamicData *)((long)pFVar14 + (ulong)bVar18 * -0x10 + 8);
  }
  *(undefined4 *)&(this->pos)._lat = 0;
  *(undefined4 *)((long)&(this->pos)._lat + 4) = 0x7ff80000;
  *(undefined4 *)&(this->pos)._lon = 0;
  *(undefined4 *)((long)&(this->pos)._lon + 4) = 0x7ff80000;
  *(undefined4 *)&(this->pos)._alt = 0;
  *(undefined4 *)((long)&(this->pos)._alt + 4) = 0x7ff80000;
  *(undefined4 *)&(this->pos)._ts = 0;
  *(undefined4 *)((long)&(this->pos)._ts + 4) = 0x7ff80000;
  *(undefined4 *)&(this->pos)._head = 0;
  *(undefined4 *)((long)&(this->pos)._head + 4) = 0x7ff80000;
  *(undefined4 *)&(this->pos)._pitch = 0;
  *(undefined4 *)((long)&(this->pos)._pitch + 4) = 0x7ff80000;
  (this->pos)._roll = NAN;
  (this->pos).mergeCount = 1;
  (this->pos).f = (posFlagsTy)0x0;
  (this->pos).edgeIdx = 0xffffffffffffffff;
  sRead.fds_bits[0] = (__fd_mask)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sRead,"data.adsbhub.org","");
  local_270 = &(this->tcpStream).super_SocketNetworking;
  XPMP2::SocketNetworking::Connect(local_270,(string *)&sRead,0x138a,0x2000,60000);
  if ((__fd_mask *)sRead.fds_bits[0] != p_Var1) {
    operator_delete((void *)sRead.fds_bits[0],sRead.fds_bits[2] + 1);
  }
  iVar16 = (this->tcpStream).super_SocketNetworking.f_socket;
  __pipedes = this->streamPipe;
  iVar6 = pipe(__pipedes);
  if (iVar6 < 0) {
    pNVar9 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
    sRead.fds_bits[0] = (__fd_mask)p_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sRead,"Couldn\'t create pipe","");
    XPMP2::NetRuntimeError::NetRuntimeError(pNVar9,(string *)&sRead);
    __cxa_throw(pNVar9,&XPMP2::NetRuntimeError::typeinfo,XPMP2::NetRuntimeError::~NetRuntimeError);
  }
  fcntl(*__pipedes,4,0x800);
  iVar16 = iVar16 + 1;
  iVar6 = this->streamPipe[0] + 1;
  if (iVar6 < iVar16) {
    iVar6 = iVar16;
  }
  local_280 = "";
  local_278 = __pipedes;
  do {
    iVar16 = (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
               _vptr_LTChannel[4])(this);
    if (((char)iVar16 == '\0') ||
       (iVar16 = (this->tcpStream).super_SocketNetworking.f_socket, iVar16 == -1)) break;
    sRead.fds_bits[0xe] = 0;
    sRead.fds_bits[0xf] = 0;
    sRead.fds_bits[0xc] = 0;
    sRead.fds_bits[0xd] = 0;
    sRead.fds_bits[10] = 0;
    sRead.fds_bits[0xb] = 0;
    sRead.fds_bits[8] = 0;
    sRead.fds_bits[9] = 0;
    sRead.fds_bits[6] = 0;
    sRead.fds_bits[7] = 0;
    sRead.fds_bits[4] = 0;
    sRead.fds_bits[5] = 0;
    sRead.fds_bits[2] = 0;
    sRead.fds_bits[3] = 0;
    sRead.fds_bits[0] = 0;
    sRead.fds_bits[1] = 0;
    iVar7 = iVar16 + 0x3f;
    if (-1 < iVar16) {
      iVar7 = iVar16;
    }
    sRead.fds_bits[iVar7 >> 6] = sRead.fds_bits[iVar7 >> 6] | 1L << ((byte)iVar16 & 0x3f);
    iVar16 = *__pipedes;
    iVar7 = iVar16 + 0x3f;
    if (-1 < iVar16) {
      iVar7 = iVar16;
    }
    sRead.fds_bits[iVar7 >> 6] = sRead.fds_bits[iVar7 >> 6] | 1L << ((byte)(iVar16 % 0x40) & 0x3f);
    timeout.tv_sec = 0x3c;
    timeout.tv_usec = 0;
    __timeout = (timeval *)&timeout;
    iVar16 = select(iVar6,(fd_set *)&sRead,(fd_set *)0x0,(fd_set *)0x0,__timeout);
    __flags = (int)__timeout;
    iVar7 = (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
              _vptr_LTChannel[4])(this);
    if ((char)iVar7 == '\0') break;
    if (iVar16 == 0) {
      pNVar9 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2a0,"\'select\' ran into a timeout","");
      XPMP2::NetRuntimeError::NetRuntimeError(pNVar9,&local_2a0);
      __cxa_throw(pNVar9,&XPMP2::NetRuntimeError::typeinfo,XPMP2::NetRuntimeError::~NetRuntimeError)
      ;
    }
    if (iVar16 == -1) {
      pNVar9 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"\'select\' failed","");
      XPMP2::NetRuntimeError::NetRuntimeError(pNVar9,&local_2a0);
      __cxa_throw(pNVar9,&XPMP2::NetRuntimeError::typeinfo,XPMP2::NetRuntimeError::~NetRuntimeError)
      ;
    }
    if (0 < iVar16) {
      uVar3 = (this->tcpStream).super_SocketNetworking.f_socket;
      uVar10 = uVar3 + 0x3f;
      if (-1 < (int)uVar3) {
        uVar10 = uVar3;
      }
      if (((ulong)sRead.fds_bits[(int)uVar10 >> 6] >> ((ulong)uVar3 & 0x3f) & 1) != 0) {
        num = XPMP2::SocketNetworking::recv
                        (local_270,0,(void *)0x0,sRead.fds_bits[(int)uVar10 >> 6],__flags);
        if ((long)num < 1) {
          GetPublicIPv4_abi_cxx11_();
          __rhs = &this->sPublicIPv4addr;
          std::__cxx11::string::operator=((string *)__rhs,(string *)&local_2a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
          }
          this->eFormat = FMT_NULL_DATA;
          if ((int)dataRefs.iLogLevel < 4) {
            sVar4 = (this->sPublicIPv4addr)._M_string_length;
            if (sVar4 == 0) {
              _Var15._M_p = "";
            }
            else {
              local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_248,"\nYour public IP address appears to be ","");
              std::operator+(&local_2a0,&local_248,__rhs);
              _Var15._M_p = local_2a0._M_dataplus._M_p;
            }
            LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
                   ,0xcc,"Main",logERR,
                   "Received no data from ADSBHub. Verify \'Read Access\' configuration at ADSBHub!%s"
                   ,_Var15._M_p);
            if (sVar4 != 0) {
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                operator_delete(local_2a0._M_dataplus._M_p,
                                local_2a0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_dataplus._M_p != &local_248.field_2) {
                operator_delete(local_248._M_dataplus._M_p,
                                local_248.field_2._M_allocated_capacity + 1);
              }
            }
          }
          sVar4 = (this->sPublicIPv4addr)._M_string_length;
          if (sVar4 != 0) {
            local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_268,"\nYour public IP address appears to be ","");
            std::operator+(&local_228,&local_268,__rhs);
            local_280 = local_228._M_dataplus._M_p;
          }
          CreateMsgWindow(12.0,logERR,
                          "Received no data from ADSBHub. Verify \'Read Access\' configuration at ADSBHub!%s"
                          ,local_280);
          if (sVar4 != 0) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_dataplus._M_p != &local_268.field_2) {
              operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1
                             );
            }
          }
          pNVar9 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1f8,
                     "Read no data from TCP socket (IP address correctly set up in ADSBHub settings?)"
                     ,"");
          XPMP2::NetRuntimeError::NetRuntimeError(pNVar9,&local_1f8);
          __cxa_throw(pNVar9,&XPMP2::NetRuntimeError::typeinfo,
                      XPMP2::NetRuntimeError::~NetRuntimeError);
        }
        if ((2 < (long)num) && (this->eFormat == FMT_UNKNOWN)) {
          pcVar17 = (this->tcpStream).super_SocketNetworking.buf;
          if (pcVar17 == (char *)0x0) {
            pcVar17 = "";
          }
          iVar16 = isalpha((int)*pcVar17);
          if ((iVar16 == 0) || (iVar16 = isalpha((int)pcVar17[1]), iVar16 == 0)) {
LAB_0014b2ae:
            FVar11 = FMT_ComprVRS;
          }
          else {
            cVar2 = pcVar17[2];
            iVar16 = isalpha((int)cVar2);
            FVar11 = FMT_SBS;
            if ((cVar2 != 0x2c) && (iVar16 == 0)) goto LAB_0014b2ae;
          }
          this->eFormat = FVar11;
          __pipedes = local_278;
        }
        rVar8 = std::chrono::_V2::steady_clock::now();
        (this->lastData).__d.__r = rVar8;
        switch(this->eFormat) {
        case FMT_UNKNOWN:
        case FMT_NULL_DATA:
          pNVar9 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
          local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2a0,"Format yet unknown, received too few data","");
          XPMP2::NetRuntimeError::NetRuntimeError(pNVar9,&local_2a0);
          __cxa_throw(pNVar9,&XPMP2::NetRuntimeError::typeinfo,
                      XPMP2::NetRuntimeError::~NetRuntimeError);
        case FMT_SBS:
          pcVar17 = (this->tcpStream).super_SocketNetworking.buf;
          if (pcVar17 == (char *)0x0) {
            pcVar17 = "";
          }
          bVar5 = StreamProcessDataSBS(this,num,pcVar17);
          if (!bVar5) {
            pNVar9 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
            local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2a0,"StreamProcessDataSBS failed","");
            XPMP2::NetRuntimeError::NetRuntimeError(pNVar9,&local_2a0);
            __cxa_throw(pNVar9,&XPMP2::NetRuntimeError::typeinfo,
                        XPMP2::NetRuntimeError::~NetRuntimeError);
          }
          break;
        case FMT_ComprVRS:
          buffer = (uint8_t *)(this->tcpStream).super_SocketNetworking.buf;
          if (buffer == (uint8_t *)0x0) {
            buffer = "";
          }
          bVar5 = StreamProcessDataVRS(this,num,buffer);
          if (!bVar5) {
            pNVar9 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
            local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2a0,"StreamProcessDataVRS failed","");
            XPMP2::NetRuntimeError::NetRuntimeError(pNVar9,&local_2a0);
            __cxa_throw(pNVar9,&XPMP2::NetRuntimeError::typeinfo,
                        XPMP2::NetRuntimeError::~NetRuntimeError);
          }
        }
      }
    }
  } while ((char)iVar7 != '\0');
  lVar12 = 0;
  do {
    iVar16 = *(int *)((long)this->streamPipe + lVar12);
    if (iVar16 != -1) {
      close(iVar16);
    }
    *(undefined4 *)((long)this->streamPipe + lVar12) = 0xffffffff;
    lVar12 = lVar12 + 4;
  } while (lVar12 != 8);
  XPMP2::TCPConnection::Close(&this->tcpStream);
  ThreadSettings::~ThreadSettings(&TS);
  return;
}

Assistant:

void ADSBHubConnection::Main ()
{
    // This is a communication thread's main function, set thread's name and C locale
    ThreadSettings TS ("LT_ADSBHub", LC_ALL_MASK);

    try {
        // Clear some data so we can also cleanly restart
        eFormat = FMT_UNKNOWN;
        lnLeftOver.clear();
        fdKey.clear();
        stat = LTFlightData::FDStaticData();
        dyn = LTFlightData::FDDynamicData();
        pos = positionTy();

        // open a TCP connection to APRS.glidernet.org
        tcpStream.Connect(ADSBHUB_HOST, ADSBHUB_PORT, ADSBHUB_BUF_SIZE, unsigned(ADSBHUB_TIMEOUT_S * 1000));
        int maxSock = (int)tcpStream.getSocket() + 1;
#if APL == 1 || LIN == 1
        // the self-pipe to shut down the TCP socket gracefully
        if (pipe(streamPipe) < 0)
            throw XPMP2::NetRuntimeError("Couldn't create pipe");
        fcntl(streamPipe[0], F_SETFL, O_NONBLOCK);
        maxSock = std::max(maxSock, streamPipe[0]+1);
#endif
        
        // *** Main Loop ***
        while (shallRun() && tcpStream.isOpen())
        {
            // wait for some signal on either socket (Stream or self-pipe)
            fd_set sRead;
            FD_ZERO(&sRead);
            FD_SET(tcpStream.getSocket(), &sRead);     // check our socket
#if APL == 1 || LIN == 1
            FD_SET(streamPipe[0], &sRead);              // check the self-pipe
#endif
            struct timeval timeout = { ADSBHUB_TIMEOUT_S, 0 };
            int retval = select(maxSock, &sRead, NULL, NULL, &timeout);
            
            // short-cut if we are to shut down (return from 'select' due to closed socket)
            if (!shallRun())
                break;

            // select call failed???
            if (retval == -1)
                throw XPMP2::NetRuntimeError("'select' failed");
            else if (retval == 0)
                throw XPMP2::NetRuntimeError("'select' ran into a timeout");

            // select successful - traffic data
            if (retval > 0 && FD_ISSET(tcpStream.getSocket(), &sRead))
            {
                // read Stream data
                long rcvdBytes = tcpStream.recv();
                
                // received something?
                if (rcvdBytes > 0)
                {
                    // if not yet decided: decided on received message format (very first frame only)
                    if (!eFormat && rcvdBytes >= 3) {
                        const char* p = tcpStream.getBuf();
                        if (std::isalpha(p[0]) && std::isalpha(p[1]) &&
                            (std::isalpha(p[2]) || p[2] == ','))
                            eFormat = FMT_SBS;
                        else
                            eFormat = FMT_ComprVRS;
                    }
                    
                    // have it processed
                    lastData = std::chrono::steady_clock::now();
                    switch (eFormat) {
                        case FMT_SBS:
                            if (!StreamProcessDataSBS(size_t(rcvdBytes), tcpStream.getBuf()))
                                throw XPMP2::NetRuntimeError("StreamProcessDataSBS failed");
                            break;
                        case FMT_ComprVRS:
                            if (!StreamProcessDataVRS(size_t(rcvdBytes), (const uint8_t*)tcpStream.getBuf()))
                                throw XPMP2::NetRuntimeError("StreamProcessDataVRS failed");
                            break;
                        case FMT_NULL_DATA:
                        case FMT_UNKNOWN:
                            throw XPMP2::NetRuntimeError("Format yet unknown, received too few data");
                    }
                }
                else {
                    sPublicIPv4addr = GetPublicIPv4();
                    eFormat = FMT_NULL_DATA;
                    SHOW_MSG(logERR, "Received no data from ADSBHub. Verify 'Read Access' configuration at ADSBHub!%s",
                             sPublicIPv4addr.empty() ? "" : (std::string("\nYour public IP address appears to be ") + sPublicIPv4addr).c_str());
                    throw XPMP2::NetRuntimeError("Read no data from TCP socket (IP address correctly set up in ADSBHub settings?)");
                }
            }
        }
    }
    catch (std::runtime_error& e) {
        LOG_MSG(logERR, ERR_TCP_LISTENACCEPT, ChName(),
                ADSBHUB_HOST, std::to_string(ADSBHUB_PORT).c_str(),
                e.what());
        // Set channel to invalid
        SetValid(false,true);
    }
    
#if APL == 1 || LIN == 1
    // close the self-pipe sockets
    for (SOCKET &s: streamPipe) {
        if (s != INVALID_SOCKET) close(s);
        s = INVALID_SOCKET;
    }
#endif
    
    // make sure the socket is closed
    tcpStream.Close();
}